

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O0

void __thiscall asl::SocketServer::~SocketServer(SocketServer *this)

{
  int in_EDX;
  __pid_t in_ESI;
  SocketServer *this_local;
  
  this->_vptr_SocketServer = (_func_int **)&PTR_serve_0018c748;
  if (this->_thread != (SockServerThread *)0x0) {
    Thread::kill(&this->_thread->super_Thread,in_ESI,in_EDX);
    if (this->_thread != (SockServerThread *)0x0) {
      (*(this->_thread->super_Thread)._vptr_Thread[1])();
    }
  }
  asl::String::~String(&this->_socketError);
  Sockets::~Sockets(&this->_sockets);
  return;
}

Assistant:

SocketServer::~SocketServer()
{
	if(_thread) {
		_thread->kill();
		delete _thread;
	}
}